

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_cast_helper.hpp
# Opt level: O2

shared_ptr<const_int>
chaiscript::detail::Cast_Helper_Inner<std::shared_ptr<const_int>_>::cast
          (Boxed_Value *ob,Type_Conversions_State *param_2)

{
  Any *this;
  __shared_ptr<const_int,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  shared_ptr<const_int> sVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  
  this = (Any *)(*(long *)param_2 + 0x18);
  if ((*(byte *)(*(long *)param_2 + 0x10) & 1) == 0) {
    Any::cast<std::shared_ptr<int>>(this);
    sVar3 = std::const_pointer_cast<int_const,int>((shared_ptr<int> *)ob);
    _Var2 = sVar3.super___shared_ptr<const_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  }
  else {
    p_Var1 = &Any::cast<std::shared_ptr<int_const>>(this)->
              super___shared_ptr<const_int,_(__gnu_cxx::_Lock_policy)2>;
    std::__shared_ptr<const_int,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<const_int,_(__gnu_cxx::_Lock_policy)2> *)ob,p_Var1);
    _Var2._M_pi = extraout_RDX;
  }
  sVar3.super___shared_ptr<const_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var2._M_pi;
  sVar3.super___shared_ptr<const_int,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)ob;
  return (shared_ptr<const_int>)sVar3.super___shared_ptr<const_int,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static auto cast(const Boxed_Value &ob, const Type_Conversions_State *) {
        if (!ob.get_type_info().is_const()) {
          return std::const_pointer_cast<const Result>(ob.get().cast<std::shared_ptr<Result>>());
        } else {
          return ob.get().cast<std::shared_ptr<const Result>>();
        }
      }